

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainingTests.cpp
# Opt level: O2

void __thiscall
IsStringContainingCharacterTests::IsStringContainingCharacterTests
          (IsStringContainingCharacterTests *this)

{
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__TestFixture_00280cc8;
  return;
}

Assistant:

virtual void Run()
	{
		Then("string containing desired character is true", [&]() {
			AssertThat(ut11::Is::String::Containing('H')("AvsdaHelloasdagf"), ut11::Is::True);
		});

		Then("string not containing desired string is false", [&]() {
			AssertThat(ut11::Is::String::Containing('W')("AvsdaHelloasdagf"), ut11::Is::False);
		});

		Then("Is::String::Containing is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::String::Containing('A')) >::value, ut11::Is::True);
		});

		Then("Is::String::Containing has an error message", []() {
			AssertThat(ut11::Is::String::Containing('w').GetErrorMessage("piano"), ut11::Is::Not::EqualTo(""));
		});
	}